

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O1

Vector3d * ear::toNormalisedVector3d(PolarPosition position)

{
  Vector3d *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double in_stack_00000008;
  double in_stack_00000010;
  
  dVar1 = sin(in_stack_00000008 * -0.017453292519943295);
  dVar2 = in_stack_00000010 * 0.017453292519943295;
  dVar3 = cos(dVar2);
  dVar4 = cos(in_stack_00000008 * -0.017453292519943295);
  dVar5 = cos(dVar2);
  dVar2 = sin(dVar2);
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
       dVar3 * dVar1;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] =
       dVar5 * dVar4;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
       dVar2;
  return in_RDI;
}

Assistant:

Eigen::Vector3d toNormalisedVector3d(PolarPosition position) {
    return cart(position.azimuth, position.elevation, 1.0);
  }